

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::RecordEndScopeObject(ByteCodeWriter *this)

{
  FunctionBody *this_00;
  DebuggerScope *currentScope;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ByteCodeWriter *this_local;
  
  if (this->m_currentDebuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xc38,"(this->m_currentDebuggerScope)",
                                "this->m_currentDebuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = this->m_functionWrite;
  currentScope = this->m_currentDebuggerScope;
  uVar3 = Data::GetCurrentOffset(&this->m_byteCodeData);
  FunctionBody::RecordEndScopeObject(this_00,currentScope,uVar3 - 1);
  PopDebuggerScope(this);
  return;
}

Assistant:

void ByteCodeWriter::RecordEndScopeObject()
    {
        Assert(this->m_currentDebuggerScope);

        m_functionWrite->RecordEndScopeObject(this->m_currentDebuggerScope, m_byteCodeData.GetCurrentOffset() - 1);
        PopDebuggerScope();
    }